

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O2

void copyitems(Item *q1,Item *q2,Item *qdest)

{
  short sVar1;
  
  do {
    if (q2 == q1) {
      return;
    }
    sVar1 = q2->itemtype;
    if (sVar1 == 1) {
      linsertsym(qdest,(q2->element).sym);
    }
    else {
      if ((sVar1 != 0x143) && (sVar1 != 0x102)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/deriv.c"
                      ,0x3f5,"void copyitems()");
      }
      linsertstr(qdest,(q2->element).str);
    }
    q2 = q2->prev;
  } while( true );
}

Assistant:

void copyitems(q1, q2, qdest) /* copy items before item */
	Item* q1, *q2, *qdest;
{
	Item* q;
	for (q = q2; q != q1; q = q->prev) {
		switch(q->itemtype) {

		case STRING:
        case VERBATIM:
			Linsertstr(qdest, STR(q));
			break;
		case SYMBOL:
			Linsertsym(qdest, SYM(q));
			break;
		default:
			/*SUPPRESS 622*/
			assert(0);
		}
	}
}